

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O0

void __thiscall
Eigen::internal::tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
          (tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *this,ResScalar *res,
          long resStride,double *blockA,double *blockB,long size,long depth,ResScalar *alpha,
          double *workspace)

{
  long *plVar1;
  Scalar *res_00;
  Scalar *pSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long i_1;
  long i1;
  ResScalar *r;
  long j1;
  long i;
  double *actual_b;
  long local_e0;
  long local_d8;
  long actualBlockSize;
  long j;
  Matrix<double,_4,_4,_0,_4,_4> buffer;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  long size_local;
  double *blockB_local;
  double *blockA_local;
  long resStride_local;
  ResScalar *res_local;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *this_local;
  
  Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)&j);
  for (actualBlockSize = 0; actualBlockSize < size; actualBlockSize = actualBlockSize + 4) {
    local_e0 = 4;
    actual_b = (double *)(size - actualBlockSize);
    plVar1 = std::min<long>(&local_e0,(long *)&actual_b);
    lVar3 = actualBlockSize;
    local_d8 = *plVar1;
    lVar4 = actualBlockSize * depth;
    DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&j);
    res_00 = PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::data
                       ((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&j);
    gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
              ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)
               ((long)buffer.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0x7f),res_00,4,blockA + depth * lVar3,blockB + lVar4,local_d8,
               depth,local_d8,*alpha,-1,-1,0,0,workspace);
    for (r = (ResScalar *)0x0; (long)r < local_d8; r = (ResScalar *)((long)r + 1)) {
      lVar5 = (actualBlockSize + (long)r) * resStride;
      for (i_1 = (long)r; i_1 < local_d8; i_1 = i_1 + 1) {
        pSVar2 = DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)&j,i_1,
                            (Index)r);
        res[lVar5 + lVar3 + i_1] = *pSVar2 + res[lVar5 + lVar3 + i_1];
      }
    }
    lVar3 = actualBlockSize + local_d8;
    gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
              ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)
               ((long)buffer.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0x7f),res + actualBlockSize * resStride + lVar3,resStride,
               blockA + depth * lVar3,blockB + lVar4,size - lVar3,depth,local_d8,*alpha,-1,-1,0,0,
               workspace);
  }
  return;
}

Assistant:

void operator()(ResScalar* res, Index resStride, const LhsScalar* blockA, const RhsScalar* blockB, Index size, Index depth, const ResScalar& alpha, RhsScalar* workspace)
  {
    gebp_kernel<LhsScalar, RhsScalar, Index, mr, nr, ConjLhs, ConjRhs> gebp_kernel;
    Matrix<ResScalar,BlockSize,BlockSize,ColMajor> buffer;

    // let's process the block per panel of actual_mc x BlockSize,
    // again, each is split into three parts, etc.
    for (Index j=0; j<size; j+=BlockSize)
    {
      Index actualBlockSize = std::min<Index>(BlockSize,size - j);
      const RhsScalar* actual_b = blockB+j*depth;

      if(UpLo==Upper)
        gebp_kernel(res+j*resStride, resStride, blockA, actual_b, j, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);

      // selfadjoint micro block
      {
        Index i = j;
        buffer.setZero();
        // 1 - apply the kernel on the temporary buffer
        gebp_kernel(buffer.data(), BlockSize, blockA+depth*i, actual_b, actualBlockSize, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
        // 2 - triangular accumulation
        for(Index j1=0; j1<actualBlockSize; ++j1)
        {
          ResScalar* r = res + (j+j1)*resStride + i;
          for(Index i1=UpLo==Lower ? j1 : 0;
              UpLo==Lower ? i1<actualBlockSize : i1<=j1; ++i1)
            r[i1] += buffer(i1,j1);
        }
      }

      if(UpLo==Lower)
      {
        Index i = j+actualBlockSize;
        gebp_kernel(res+j*resStride+i, resStride, blockA+depth*i, actual_b, size-i, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
      }
    }
  }